

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode ossl_connect(Curl_cfilter *cf,Curl_easy *data,_Bool *done)

{
  void *pvVar1;
  int iVar2;
  undefined4 uVar3;
  _Bool local_41;
  ossl_ctx *octx;
  ssl_connect_data *connssl;
  CURLcode result;
  _Bool *done_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  connssl._4_4_ = CURLE_OK;
  pvVar1 = cf->ctx;
  if (*(int *)((long)pvVar1 + 0xb8) == 3) {
    *done = true;
    return CURLE_OK;
  }
  *done = false;
  *(undefined4 *)((long)pvVar1 + 0xc4) = 0;
  if (*(int *)((long)pvVar1 + 0xbc) == 0) {
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
      Curl_trc_cf_infof(data,cf,"ossl_connect, step1");
    }
    connssl._4_4_ = ossl_connect_step1(cf,data);
    if (connssl._4_4_ != CURLE_OK) goto LAB_001b6064;
  }
  if (*(int *)((long)pvVar1 + 0xbc) == 1) {
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
      Curl_trc_cf_infof(data,cf,"ossl_connect, step2");
    }
    if (*(int *)((long)pvVar1 + 0xc0) == 1) goto LAB_001b6064;
    if (*(int *)((long)pvVar1 + 0xc0) == 2) {
      connssl._4_4_ = ossl_send_earlydata(cf,data);
      if (connssl._4_4_ != CURLE_OK) goto LAB_001b6064;
      *(undefined4 *)((long)pvVar1 + 0xc0) = 3;
    }
    connssl._4_4_ = ossl_connect_step2(cf,data);
    if (connssl._4_4_ != CURLE_OK) goto LAB_001b6064;
  }
  if (*(int *)((long)pvVar1 + 0xbc) == 2) {
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
      Curl_trc_cf_infof(data,cf,"ossl_connect, step3");
    }
    connssl._4_4_ = ossl_connect_step3(cf,data);
    if (connssl._4_4_ != CURLE_OK) goto LAB_001b6064;
    *(undefined4 *)((long)pvVar1 + 0xbc) = 3;
    if (*(int *)((long)pvVar1 + 0xc0) != 0) {
      iVar2 = SSL_get_early_data_status(*(undefined8 *)(*(long *)((long)pvVar1 + 0x40) + 8));
      uVar3 = 5;
      if (iVar2 == 2) {
        uVar3 = 4;
      }
      *(undefined4 *)((long)pvVar1 + 0xc0) = uVar3;
    }
  }
  if (*(int *)((long)pvVar1 + 0xbc) == 3) {
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
      Curl_trc_cf_infof(data,cf,"ossl_connect, done");
    }
    *(undefined4 *)((long)pvVar1 + 0xb8) = 3;
  }
LAB_001b6064:
  if (connssl._4_4_ == CURLE_AGAIN) {
    *done = false;
    cf_local._4_4_ = CURLE_OK;
  }
  else {
    local_41 = true;
    if (*(int *)((long)pvVar1 + 0xb8) != 3) {
      local_41 = *(int *)((long)pvVar1 + 0xb8) == 1;
    }
    *done = local_41;
    cf_local._4_4_ = connssl._4_4_;
  }
  return cf_local._4_4_;
}

Assistant:

static CURLcode ossl_connect(struct Curl_cfilter *cf,
                             struct Curl_easy *data,
                             bool *done)
{
  CURLcode result = CURLE_OK;
  struct ssl_connect_data *connssl = cf->ctx;

  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  *done = FALSE;
  connssl->io_need = CURL_SSL_IO_NEED_NONE;

  if(ssl_connect_1 == connssl->connecting_state) {
    CURL_TRC_CF(data, cf, "ossl_connect, step1");
    result = ossl_connect_step1(cf, data);
    if(result)
      goto out;
  }

  if(ssl_connect_2 == connssl->connecting_state) {
    CURL_TRC_CF(data, cf, "ossl_connect, step2");
#ifdef HAVE_OPENSSL_EARLYDATA
    if(connssl->earlydata_state == ssl_earlydata_await) {
      goto out;
    }
    else if(connssl->earlydata_state == ssl_earlydata_sending) {
      result = ossl_send_earlydata(cf, data);
      if(result)
        goto out;
      connssl->earlydata_state = ssl_earlydata_sent;
    }
#endif
    DEBUGASSERT((connssl->earlydata_state == ssl_earlydata_none) ||
                (connssl->earlydata_state == ssl_earlydata_sent));

    result = ossl_connect_step2(cf, data);
    if(result)
      goto out;
  }

  if(ssl_connect_3 == connssl->connecting_state) {
    CURL_TRC_CF(data, cf, "ossl_connect, step3");
    result = ossl_connect_step3(cf, data);
    if(result)
      goto out;
    connssl->connecting_state = ssl_connect_done;
#ifdef HAVE_OPENSSL_EARLYDATA
    if(connssl->earlydata_state > ssl_earlydata_none) {
      struct ossl_ctx *octx = (struct ossl_ctx *)connssl->backend;
      /* We should be in this state by now */
      DEBUGASSERT(connssl->earlydata_state == ssl_earlydata_sent);
      connssl->earlydata_state =
        (SSL_get_early_data_status(octx->ssl) == SSL_EARLY_DATA_ACCEPTED) ?
        ssl_earlydata_accepted : ssl_earlydata_rejected;
    }
#endif
  }

  if(ssl_connect_done == connssl->connecting_state) {
    CURL_TRC_CF(data, cf, "ossl_connect, done");
    connssl->state = ssl_connection_complete;
  }

out:
  if(result == CURLE_AGAIN) {
    *done = FALSE;
    return CURLE_OK;
  }
  *done = ((connssl->state == ssl_connection_complete) ||
           (connssl->state == ssl_connection_deferred));
  return result;
}